

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O0

void __thiscall PressDelayHandler::~PressDelayHandler(PressDelayHandler *this)

{
  PressDelayHandler *in_RDI;
  
  ~PressDelayHandler(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

PressDelayHandler(QObject *parent = nullptr)
        : QObject(parent)
        , sendingEvent(false)
        , mouseButton(Qt::NoButton)
        , mouseTarget(nullptr)
        , mouseEventSource(Qt::MouseEventNotSynthesized)
    { }